

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_struct_field_sync_write
          (t_rs_generator *this,string *field_var,bool field_var_is_ref,t_field *tfield,e_req req)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_type *this_00;
  int iVar3;
  t_type *ptVar4;
  ostream *poVar5;
  undefined7 in_register_00000011;
  t_rs_generator *this_01;
  char *pcVar6;
  allocator local_219;
  string local_218;
  undefined4 local_1f4;
  string *local_1f0;
  string let_var;
  string field_ident_string;
  ostringstream field_stream;
  
  local_1f4 = (undefined4)CONCAT71(in_register_00000011,field_var_is_ref);
  this_00 = tfield->type_;
  local_1f0 = field_var;
  ptVar4 = t_type::get_true_type(this_00);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&field_stream);
  poVar5 = std::operator<<((ostream *)&field_stream,"TFieldIdentifier::new(");
  poVar5 = std::operator<<(poVar5,"\"");
  poVar5 = std::operator<<(poVar5,(string *)&tfield->name_);
  poVar5 = std::operator<<(poVar5,"\"");
  this_01 = (t_rs_generator *)0x2fdaef;
  poVar5 = std::operator<<(poVar5,", ");
  to_rust_field_type_enum_abi_cxx11_(&field_ident_string,this_01,this_00);
  poVar5 = std::operator<<(poVar5,(string *)&field_ident_string);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,tfield->key_);
  std::operator<<(poVar5,")");
  std::__cxx11::string::~string((string *)&field_ident_string);
  std::__cxx11::stringbuf::str();
  if (req - T_OPTIONAL < 2) {
    iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[5])(ptVar4);
    if ((char)iVar3 == '\0') {
      pcVar6 = "ref fld_var";
    }
    else {
      iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[6])(ptVar4);
      pcVar6 = "fld_var";
      if ((char)iVar3 != '\0') {
        pcVar6 = "ref fld_var";
      }
    }
    std::__cxx11::string::string((string *)&let_var,pcVar6,(allocator *)&local_218);
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar1 = &this->f_gen_;
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,"if let Some(");
    poVar5 = std::operator<<(poVar5,(string *)&let_var);
    poVar5 = std::operator<<(poVar5,") = ");
    poVar5 = std::operator<<(poVar5,(string *)local_1f0);
    poVar5 = std::operator<<(poVar5," {");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_begin(&");
    poVar5 = std::operator<<(poVar5,(string *)&field_ident_string);
    poVar5 = std::operator<<(poVar5,")?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::string((string *)&local_218,"fld_var",&local_219);
    render_type_sync_write(this,&local_218,true,this_00);
    std::__cxx11::string::~string((string *)&local_218);
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_end()?");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    piVar2 = &(this->super_t_generator).indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_218,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)poVar1,(string *)&local_218);
    poVar5 = std::operator<<(poVar5,"}");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    t_generator::indent_abi_cxx11_(&let_var,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&let_var);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_begin(&");
    poVar5 = std::operator<<(poVar5,(string *)&field_ident_string);
    poVar5 = std::operator<<(poVar5,")?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&let_var);
    render_type_sync_write(this,local_1f0,local_1f4._0_1_,tfield->type_);
    t_generator::indent_abi_cxx11_(&let_var,&this->super_t_generator);
    poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&let_var);
    poVar5 = std::operator<<(poVar5,"o_prot.write_field_end()?;");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&let_var);
  std::__cxx11::string::~string((string *)&field_ident_string);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&field_stream);
  return;
}

Assistant:

void t_rs_generator::render_struct_field_sync_write(
  const string &field_var,
  bool field_var_is_ref,
  t_field *tfield,
  t_field::e_req req
) {
  t_type* field_type = tfield->get_type();
  t_type* actual_type = get_true_type(field_type);

  ostringstream field_stream;
  field_stream
    << "TFieldIdentifier::new("
    << "\"" << tfield->get_name() << "\"" << ", " // note: use *original* name
    << to_rust_field_type_enum(field_type) << ", "
    << tfield->get_key() << ")";
  string field_ident_string = field_stream.str();

  if (is_optional(req)) {
    string let_var((actual_type->is_base_type() && !actual_type->is_string()) ? "fld_var" : "ref fld_var");
    f_gen_ << indent() << "if let Some(" << let_var << ") = " << field_var << " {" << endl;
    indent_up();
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write("fld_var", true, field_type);
    f_gen_ << indent() << "o_prot.write_field_end()?" << endl;
    indent_down();
    /* FIXME: rethink how I deal with OPT_IN_REQ_OUT
    if (req == t_field::T_OPT_IN_REQ_OUT) {
      f_gen_ << indent() << "let field_ident = " << field_ident_string << ";" << endl;
      f_gen_ << indent() << "o_prot.write_field_begin(&field_ident)?;" << endl;
      f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
    }*/
    f_gen_ << indent() << "}" << endl;
  } else {
    f_gen_ << indent() << "o_prot.write_field_begin(&" << field_ident_string << ")?;" << endl;
    render_type_sync_write(field_var, field_var_is_ref, tfield->get_type());
    f_gen_ << indent() << "o_prot.write_field_end()?;" << endl;
  }
}